

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  long lVar1;
  size_t *psVar2;
  int64_t *piVar3;
  uchar *puVar4;
  byte *pbVar5;
  byte bVar6;
  uint32_t uVar7;
  _7zip *zip;
  unsigned_long uVar8;
  byte *pbVar9;
  uint uVar10;
  Bool BVar11;
  uchar *puVar12;
  void *pvVar13;
  uint8_t *__src;
  ssize_t sVar14;
  undefined8 uVar15;
  size_t sVar16;
  size_t sVar17;
  ulong uVar18;
  byte bVar19;
  int iVar20;
  size_t outSize;
  size_t sVar21;
  size_t sVar22;
  char *pcVar23;
  uint uVar24;
  byte *pbVar25;
  byte *pbVar26;
  uint uVar27;
  uchar *puVar28;
  ulong uVar29;
  size_t sVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  uint64_t uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  ssize_t bytes_avail;
  ZSTD_inBuffer input;
  uint local_11c;
  uint64_t local_110;
  ulong local_f8;
  uchar *local_e8;
  ulong local_d0;
  size_t local_c8;
  ulong local_c0;
  CPpmd7z_RangeDec *local_b8;
  lzma_stream *local_b0;
  size_t local_a8;
  uchar *local_a0;
  code *local_98;
  IByteIn *local_90;
  size_t local_88;
  z_stream *local_80;
  CPpmd7 *local_78;
  code *local_70;
  size_t local_68;
  uchar *local_60;
  ulong local_58;
  long local_50;
  uint8_t *local_48;
  ulong local_40;
  long local_38;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar13 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_d0);
    if (0 < (long)local_d0 && pvVar13 != (void *)0x0) {
      if (zip->pack_stream_inbytes_remaining < local_d0) {
        local_d0 = zip->pack_stream_inbytes_remaining;
      }
      zip->pack_stream_inbytes_remaining = zip->pack_stream_inbytes_remaining - local_d0;
      if (zip->folder_outbytes_remaining < local_d0) {
        local_d0 = zip->folder_outbytes_remaining;
      }
      zip->folder_outbytes_remaining = zip->folder_outbytes_remaining - local_d0;
      zip->uncompressed_buffer_bytes_remaining = local_d0;
      return 0;
    }
    pcVar23 = "Truncated 7-Zip file body";
    iVar20 = 0x54;
    goto LAB_0012e6ec;
  }
  puVar12 = zip->uncompressed_buffer;
  local_88 = minimum;
  if (puVar12 == (uchar *)0x0) {
    sVar22 = 0x10000;
    if (0x10000 < minimum) {
      sVar22 = minimum + 0x3ff & 0xfffffffffffffc00;
    }
    zip->uncompressed_buffer_size = sVar22;
    puVar12 = (uchar *)malloc(sVar22);
    zip->uncompressed_buffer = puVar12;
    if (puVar12 == (uchar *)0x0) {
      pcVar23 = "No memory for 7-Zip decompression";
      iVar20 = 0xc;
      goto LAB_0012e6ec;
    }
LAB_0012d5e1:
    zip->uncompressed_buffer_bytes_remaining = 0;
  }
  else {
    if ((minimum <= zip->uncompressed_buffer_size) &&
       (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_0012d5e1;
    lVar35 = (long)zip->uncompressed_buffer_pointer - (long)puVar12;
    if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
      lVar35 = 0;
    }
    if (zip->uncompressed_buffer_size < minimum) {
      uVar33 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar12 = (uchar *)realloc(puVar12,uVar33);
      if (puVar12 == (uchar *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for 7-Zip decompression");
        return -0x1e;
      }
      zip->uncompressed_buffer = puVar12;
      zip->uncompressed_buffer_size = uVar33;
    }
    if (lVar35 != 0) {
      memmove(zip->uncompressed_buffer,zip->uncompressed_buffer + lVar35,
              zip->uncompressed_buffer_bytes_remaining);
    }
  }
  zip->uncompressed_buffer_pointer = (uchar *)0x0;
  local_90 = &zip->bytein;
  local_b8 = &zip->range_dec;
  local_98 = Ppmd7z_RangeDec_Init;
  local_70 = Ppmd7_DecodeSymbol;
  local_78 = &zip->ppmd7_context;
  local_80 = &zip->stream;
  local_b0 = &zip->lzstream;
  local_a0 = zip->odd_bcj;
  do {
    __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_d0);
    if ((long)local_d0 < 1) {
      iVar20 = 0x54;
      pcVar23 = "Truncated 7-Zip file body";
LAB_0012d7a3:
      archive_set_error(&a->archive,iVar20,pcVar23);
      iVar20 = 1;
    }
    else {
      puVar12 = zip->uncompressed_buffer;
      local_68 = zip->uncompressed_buffer_size;
      sVar30 = zip->uncompressed_buffer_bytes_remaining;
      local_c0 = local_68 - sVar30;
      uVar33 = zip->pack_stream_inbytes_remaining;
      uVar18 = local_d0;
      if (uVar33 <= local_d0) {
        uVar18 = uVar33;
      }
      puVar4 = puVar12 + sVar30;
      uVar32 = 0;
      outSize = local_c0;
      local_110 = uVar18;
      local_f8 = local_c0;
      local_e8 = puVar4;
      if ((zip->codec == 0x21) || (zip->codec2 != 0x3030103)) {
LAB_0012d8ba:
        puVar28 = local_e8;
        sVar16 = outSize;
        if (zip->codec2 == 0x303011b) {
          sVar16 = zip->tmp_stream_bytes_remaining;
          if (sVar16 != 0) {
            sVar14 = Bcj2_Decode(zip,local_e8,outSize);
            if (sVar14 < 0) {
              bVar38 = false;
              archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
              local_11c = 0xffffffe7;
            }
            else {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar16);
              sVar16 = outSize - sVar14;
              if ((uVar33 == 0) || (sVar16 == 0)) {
                local_f8 = local_c0 - sVar16;
                local_11c = uVar32;
                if ((uVar33 == 0) && (zip->tmp_stream_bytes_remaining != 0)) {
                  local_11c = 1;
                }
                local_110 = 0;
                bVar38 = false;
                uVar32 = local_11c;
              }
              else {
                local_e8 = local_e8 + sVar14;
                bVar38 = true;
                outSize = sVar16;
              }
            }
            if (!bVar38) goto LAB_0012e44a;
          }
          puVar28 = zip->tmp_stream_buff;
          sVar16 = zip->tmp_stream_buff_size;
        }
        uVar8 = zip->codec;
        if ((long)uVar8 < 0x30401) {
          if (uVar8 == 0) {
            uVar36 = sVar16;
            if (uVar18 < sVar16) {
              uVar36 = uVar18;
            }
            memcpy(puVar28,__src,uVar36);
            sVar17 = uVar18 - uVar36;
            sVar16 = sVar16 - uVar36;
            if (uVar33 == 0) {
              uVar32 = 1;
            }
          }
          else {
            if ((uVar8 != 0x21) && (uVar8 != 0x30101)) {
LAB_0012dbfc:
              archive_set_error(&a->archive,-1,"Decompression internal error");
LAB_0012de7e:
              local_11c = 0xffffffe7;
              goto LAB_0012e44a;
            }
            (zip->lzstream).next_in = __src;
            (zip->lzstream).avail_in = uVar18;
            (zip->lzstream).next_out = puVar28;
            (zip->lzstream).avail_out = sVar16;
            uVar10 = lzma_code(local_b0,0);
            if (uVar10 != 0) {
              if (uVar10 != 1) {
                archive_set_error(&a->archive,-1,"Decompression failed(%d)",(ulong)uVar10);
                local_11c = 0xffffffe7;
                goto LAB_0012e44a;
              }
              lzma_end(local_b0);
              zip->lzstream_valid = 0;
              uVar32 = 1;
            }
            sVar17 = (zip->lzstream).avail_in;
            sVar16 = (zip->lzstream).avail_out;
          }
        }
        else {
          if (uVar8 != 0x30401) {
            if (uVar8 == 0x40108) {
              (zip->stream).next_in = __src;
              (zip->stream).avail_in = (uInt)uVar18;
              (zip->stream).next_out = puVar28;
              (zip->stream).avail_out = (uInt)sVar16;
              uVar10 = inflate(local_80,0);
              if (uVar10 != 0) {
                if (uVar10 != 1) {
                  archive_set_error(&a->archive,-1,"File decompression failed (%d)",(ulong)uVar10);
                  goto LAB_0012de7e;
                }
                uVar32 = 1;
              }
              sVar17 = (size_t)(zip->stream).avail_in;
              sVar16 = (size_t)(zip->stream).avail_out;
              goto LAB_0012dd19;
            }
            if (uVar8 != 0x4f71101) goto LAB_0012dbfc;
            local_38 = 0;
            local_50 = 0;
            local_60 = puVar28;
            local_58 = sVar16;
            local_48 = __src;
            local_40 = uVar18;
            uVar15 = ZSTD_decompressStream(zip->zstd_dstream,&local_60,&local_48);
            iVar20 = ZSTD_isError(uVar15);
            if (iVar20 == 0) {
              sVar17 = uVar18 - local_38;
              sVar16 = sVar16 - local_50;
              goto LAB_0012dd19;
            }
            local_c8 = sVar16;
            uVar15 = ZSTD_getErrorName(uVar15);
            archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",uVar15);
            local_11c = 0xffffffe7;
            goto LAB_0012e44a;
          }
          if (((zip->ppmd7_valid == 0) || (iVar20 = zip->ppmd7_stat, iVar20 < 0)) || (sVar16 == 0))
          {
            archive_set_error(&a->archive,-1,"Decompression internal error");
            local_11c = 0xffffffe7;
LAB_0012dca5:
            bVar38 = false;
            sVar17 = uVar18;
          }
          else {
            (zip->ppstream).next_in = __src;
            (zip->ppstream).avail_in = uVar18;
            (zip->ppstream).stream_in = 0;
            (zip->ppstream).next_out = puVar28;
            (zip->ppstream).avail_out = sVar16;
            if (iVar20 == 0) {
              (zip->bytein).a = a;
              (zip->bytein).Read = ppmd_read;
              (zip->range_dec).Stream = local_90;
              BVar11 = (*local_98)(local_b8);
              if (BVar11 == 0) {
                zip->ppmd7_stat = -1;
                archive_set_error(&a->archive,-1,"Failed to initialize PPMd range decoder");
              }
              else {
                if ((zip->ppstream).overconsumed == 0) {
                  zip->ppmd7_stat = 1;
                  goto LAB_0012dbe5;
                }
                zip->ppmd7_stat = -1;
              }
              local_11c = 0xffffffe7;
              goto LAB_0012dca5;
            }
LAB_0012dbe5:
            if (uVar33 == 0) {
              uVar37 = zip->folder_outbytes_remaining;
            }
            else {
              uVar37 = 0;
            }
            do {
              iVar20 = (*local_70)(local_78,&local_b8->p);
              if (iVar20 < 0) {
                zip->ppmd7_stat = -1;
                bVar38 = false;
                archive_set_error(&a->archive,0x54,"Failed to decode PPMd");
                local_11c = 0xffffffe7;
              }
              else if ((zip->ppstream).overconsumed == 0) {
                puVar28 = (zip->ppstream).next_out;
                (zip->ppstream).next_out = puVar28 + 1;
                *puVar28 = (uchar)iVar20;
                piVar3 = &(zip->ppstream).avail_out;
                *piVar3 = *piVar3 + -1;
                piVar3 = &(zip->ppstream).total_out;
                *piVar3 = *piVar3 + 1;
                bVar38 = uVar37 == 0;
                uVar37 = uVar37 - 1;
                if (bVar38) {
                  uVar37 = 0;
                }
                bVar38 = true;
              }
              else {
                zip->ppmd7_stat = -1;
                local_11c = 0xffffffe7;
                bVar38 = false;
              }
              if (!bVar38) goto LAB_0012dca5;
              sVar21 = (zip->ppstream).avail_out;
            } while ((sVar21 != 0) && ((zip->ppstream).avail_in != 0 || uVar37 != 0));
            bVar38 = true;
            sVar17 = (zip->ppstream).avail_in;
            sVar16 = sVar21;
          }
          if (!bVar38) goto LAB_0012e44a;
        }
LAB_0012dd19:
        uVar36 = local_c0;
        uVar34 = local_c0 - sVar16;
        local_f8 = uVar34;
        local_c8 = sVar16;
        if (zip->codec != 0x21) {
          uVar8 = zip->codec2;
          if ((long)uVar8 < 0x3030205) {
            if (uVar8 == 10) {
              if (uVar34 < 4) {
                local_f8 = 0;
              }
              else {
                sVar16 = 0;
                do {
                  bVar19 = puVar12[sVar16 + sVar30];
                  uVar10 = (uint)puVar12[sVar16 + sVar30 + 2] << 0x10 |
                           (uint)puVar12[sVar16 + sVar30 + 1] << 8;
                  uVar27 = uVar10 | bVar19;
                  bVar6 = puVar12[sVar16 + sVar30 + 3];
                  if ((bVar6 & 0xfc) == 0x94) {
                    iVar20 = (uVar27 | (uint)bVar6 << 0x18) - (zip->bcj_ip + (int)sVar16 >> 2);
                    puVar12[sVar16 + sVar30] = (uchar)iVar20;
                    puVar12[sVar16 + sVar30 + 1] = (uchar)((uint)iVar20 >> 8);
                    puVar12[sVar16 + sVar30 + 2] = (uchar)((uint)iVar20 >> 0x10);
                    bVar19 = (byte)((uint)iVar20 >> 0x18) & 3 | 0x94;
LAB_0012e065:
                    puVar12[sVar16 + sVar30 + 3] = bVar19;
                  }
                  else if (((bVar6 & 0x9f) == 0x90) && (((uVar27 >> 3) + 0x20000 & 0x1c0000) == 0))
                  {
                    uVar27 = (bVar6 >> 5 & 3 | (uVar10 | bVar19 & 0xffffffe0) >> 3) -
                             (zip->bcj_ip + (int)sVar16 >> 0xc);
                    uVar10 = uVar27 * 8 & 0x1fffe0;
                    puVar12[sVar16 + sVar30] = bVar19 & 0x1f | (byte)uVar10;
                    puVar12[sVar16 + sVar30 + 1] = (uchar)(uVar27 >> 5);
                    puVar12[sVar16 + sVar30 + 2] =
                         (byte)(-(uVar27 & 0x20000) >> 0x10) & 0xe0 | (byte)(uVar10 >> 0x10);
                    bVar19 = (char)uVar27 << 5 | 0x90;
                    goto LAB_0012e065;
                  }
                  local_f8 = sVar16 + 4;
                  uVar33 = sVar16 + 8;
                  sVar16 = local_f8;
                } while (uVar33 <= uVar34);
              }
              zip->bcj_ip = zip->bcj_ip + (int)local_f8;
            }
            else if (uVar8 == 0x3030103) {
              if (uVar34 < 5) {
                local_f8 = 0;
              }
              else {
                sVar21 = zip->bcj_prevPosT;
                uVar29 = (ulong)zip->bcj_prevMask;
                uVar7 = zip->bcj_ip;
                pbVar5 = puVar4 + (uVar34 - 4);
                local_f8 = 0;
                do {
                  pbVar26 = puVar4 + local_f8;
                  bVar38 = pbVar26 < pbVar5;
                  if ((bVar38) && ((*pbVar26 & 0xfe) != 0xe8)) {
                    lVar35 = local_f8 + ((sVar30 + sVar16) - local_68) + 5;
                    pbVar9 = puVar12 + local_f8 + sVar30 + 1;
                    do {
                      pbVar25 = pbVar9;
                      pbVar26 = pbVar5;
                      if (lVar35 == 0) break;
                      lVar35 = lVar35 + 1;
                      pbVar26 = pbVar25;
                      pbVar9 = pbVar25 + 1;
                    } while ((*pbVar25 & 0xfe) != 0xe8);
                    bVar38 = pbVar25 < pbVar5;
                  }
                  local_f8 = (long)pbVar26 - (long)puVar4;
                  if (bVar38) {
                    sVar21 = local_f8 - sVar21;
                    if (sVar21 < 4) {
                      uVar27 = (int)uVar29 << ((char)sVar21 - 1U & 0x1f);
                      uVar10 = uVar27 & 7;
                      if (uVar10 == 0) goto LAB_0012e231;
                      bVar39 = (0xe8U >> uVar10 & 1) != 0;
                      bVar40 = (byte)(pbVar26[4 - (ulong)(byte)(&x86_Convert_kMaskToBitNumber)
                                                               [uVar10]] + 1) < 2;
                      if (bVar40 || bVar39) {
                        sVar21 = local_f8;
                        uVar10 = (uVar27 & 3) * 2 + 1;
                      }
                      local_f8 = local_f8 + (bVar40 || bVar39);
                      uVar29 = (ulong)uVar10;
                      if (bVar40 || bVar39) goto LAB_0012e2fe;
                    }
                    else {
LAB_0012e231:
                      uVar29 = 0;
                    }
                    sVar21 = local_f8;
                    bVar19 = pbVar26[4];
                    if ((bVar19 == 0xff) || (bVar19 == 0)) {
                      uVar10 = (uint)pbVar26[1] |
                               (uint)pbVar26[2] << 8 |
                               (uint)pbVar26[3] << 0x10 | (uint)bVar19 << 0x18;
                      do {
                        uVar27 = uVar10 - (uVar7 + (int)sVar21);
                        if ((uint)uVar29 == 0) {
LAB_0012e2b7:
                          bVar39 = false;
                        }
                        else {
                          uVar24 = uVar27 >> ((&x86_Convert_kMaskToBitNumber)[uVar29] * -8 + 0x18U &
                                             0x1f);
                          if (((char)uVar24 != -1) && ((uVar24 & 0xff) != 0)) goto LAB_0012e2b7;
                          uVar10 = ~(-1 << ((&x86_Convert_kMaskToBitNumber)[uVar29] * -8 & 0x1fU) ^
                                    uVar27);
                          bVar39 = true;
                        }
                      } while (bVar39);
                      pbVar26[4] = (byte)((int)(uVar27 * 0x80) >> 0x1f);
                      pbVar26[3] = (byte)(uVar27 >> 0x10);
                      pbVar26[2] = (byte)(uVar27 >> 8);
                      pbVar26[1] = (byte)uVar27;
                      local_f8 = sVar21 + 5;
                    }
                    else {
                      uVar29 = (ulong)(((uint)uVar29 & 3) * 2 + 1);
                      local_f8 = sVar21 + 1;
                    }
                  }
LAB_0012e2fe:
                } while (bVar38);
                zip->bcj_prevPosT = sVar21;
                zip->bcj_prevMask = (uint32_t)uVar29;
                zip->bcj_ip = zip->bcj_ip + (int)local_f8;
                local_a8 = sVar17;
              }
              sVar22 = uVar34 - local_f8;
              zip->odd_bcj_size = sVar22;
              if ((((sVar22 == 0) || (uVar32 != 0)) || (4 < sVar22)) || (uVar33 == 0)) {
                zip->odd_bcj_size = 0;
                local_f8 = uVar34;
              }
              else {
                memcpy(local_a0,puVar4 + local_f8,sVar22);
              }
            }
          }
          else if (uVar8 == 0x3030205) {
            if ((uVar34 & 0xfffffffffffffffc) == 0) {
              local_f8 = 0;
            }
            else {
              iVar20 = 0;
              local_f8 = 0;
              do {
                if ((puVar12[local_f8 + sVar30] & 0xfc) == 0x48) {
                  bVar19 = puVar12[local_f8 + sVar30 + 3];
                  if ((bVar19 & 3) == 1) {
                    uVar7 = zip->bcj_ip;
                    iVar31 = ((bVar19 & 0xfffffffc |
                              (uint)puVar12[local_f8 + sVar30 + 2] << 8 |
                              (uint)puVar12[local_f8 + sVar30 + 1] << 0x10 |
                              (puVar12[local_f8 + sVar30] & 3) << 0x18) - uVar7) + iVar20;
                    puVar12[local_f8 + sVar30] = (byte)((uint)iVar31 >> 0x18) & 3 | 0x48;
                    puVar12[local_f8 + sVar30 + 1] = (uchar)((uint)iVar31 >> 0x10);
                    puVar12[local_f8 + sVar30 + 2] = (uchar)((uint)iVar31 >> 8);
                    puVar12[local_f8 + sVar30 + 3] =
                         ((bVar19 & 0xfc) - (char)uVar7) + (char)iVar20 | bVar19 & 3;
                  }
                }
                local_f8 = local_f8 + 4;
                iVar20 = iVar20 + -4;
              } while (local_f8 < (uVar34 & 0xfffffffffffffffc));
            }
            zip->bcj_ip = zip->bcj_ip + (int)local_f8;
          }
          else if (uVar8 == 0x3030501) {
            if (uVar34 < 4) {
              local_f8 = 0;
            }
            else {
              uVar33 = 4;
              lVar35 = 0;
              do {
                if (puVar4[uVar33 - 1] == 0xeb) {
                  uVar10 = ((((uint)puVar4[uVar33 - 3] << 10 | (uint)puVar4[uVar33 - 2] << 0x12) +
                            (uint)puVar4[uVar33 - 4] * 4) - zip->bcj_ip) + (int)lVar35;
                  puVar4[uVar33 - 4] = (uchar)(uVar10 >> 2);
                  puVar4[uVar33 - 3] = (uchar)(uVar10 >> 10);
                  puVar4[uVar33 - 2] = (uchar)(uVar10 >> 0x12);
                }
                uVar33 = uVar33 + 4;
                lVar35 = lVar35 + -4;
              } while (uVar33 <= uVar34);
              local_f8 = -lVar35;
            }
            zip->bcj_ip = zip->bcj_ip + (int)local_f8;
          }
          else if (uVar8 == 0x3030805) {
            if ((uVar34 & 0xfffffffffffffffc) == 0) {
              local_f8 = 0;
            }
            else {
              iVar20 = 0;
              local_f8 = 0;
              do {
                uVar10 = (uint)puVar12[local_f8 + sVar30 + 1] * 0x10000 +
                         (uint)puVar12[local_f8 + sVar30] * 0x1000000 >> 0x16;
                if ((uVar10 == 0x1ff) || (uVar10 == 0x100)) {
                  uVar10 = (((uint)puVar12[local_f8 + sVar30] * 0x1000000 +
                             (uint)puVar12[local_f8 + sVar30 + 1] * 0x10000 +
                            (uint)puVar12[local_f8 + sVar30 + 3] +
                            (uint)puVar12[local_f8 + sVar30 + 2] * 0x100) * 4 - zip->bcj_ip) +
                           iVar20;
                  uVar27 = uVar10 >> 2;
                  iVar31 = 0x40000000 - (uVar27 & 0x400000);
                  puVar12[local_f8 + sVar30] = (byte)((uint)iVar31 >> 0x18) | 0x40;
                  puVar12[local_f8 + sVar30 + 1] =
                       (byte)(uVar27 >> 0x10) & 0x3f | (byte)((uint)iVar31 >> 0x10);
                  puVar12[local_f8 + sVar30 + 2] = (uchar)(uVar10 >> 10);
                  puVar12[local_f8 + sVar30 + 3] = (uchar)uVar27;
                }
                local_f8 = local_f8 + 4;
                iVar20 = iVar20 + -4;
              } while (local_f8 < (uVar34 & 0xfffffffffffffffc));
            }
            zip->bcj_ip = zip->bcj_ip + (int)local_f8;
          }
        }
        local_110 = uVar18 - sVar17;
        local_11c = uVar32;
        if (zip->codec2 == 0x303011b) {
          uVar33 = zip->tmp_stream_buff_size - local_c8;
          if (zip->main_stream_bytes_remaining <= uVar33) {
            uVar33 = zip->main_stream_bytes_remaining;
          }
          zip->tmp_stream_bytes_avail = uVar33;
          zip->tmp_stream_bytes_remaining = uVar33;
          sVar14 = Bcj2_Decode(zip,local_e8,outSize);
          if (sVar14 < 0) {
            archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
            local_11c = 0xffffffe7;
          }
          else {
            zip->main_stream_bytes_remaining =
                 zip->main_stream_bytes_remaining +
                 (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
            local_f8 = (uVar36 - outSize) + sVar14;
          }
        }
      }
      else {
        if ((local_c0 < 5 && uVar33 != 0) && (zip->odd_bcj_size != 0)) {
          local_f8 = 0;
          uVar32 = 0;
          bVar38 = false;
          local_11c = 0;
          local_110 = 0;
        }
        else {
          if (local_c0 != 0 && zip->odd_bcj_size != 0) {
            lVar35 = 0;
            do {
              puVar4[lVar35] = zip->odd_bcj[lVar35];
              lVar1 = lVar35 + 1;
              psVar2 = &zip->odd_bcj_size;
              *psVar2 = *psVar2 - 1;
              if (*psVar2 == 0) break;
              bVar38 = local_c0 - 1 != lVar35;
              lVar35 = lVar1;
            } while (bVar38);
            local_e8 = puVar4 + lVar1;
            outSize = local_c0 - lVar1;
          }
          if ((uVar33 == 0) || (outSize == 0)) {
            uVar32 = (uint)(uVar33 == 0);
            local_f8 = local_c0 - outSize;
            local_110 = 0;
            bVar38 = false;
            local_11c = (uint)(uVar33 == 0);
          }
          else {
            uVar32 = 0;
            bVar38 = true;
          }
        }
        if (bVar38) goto LAB_0012d8ba;
      }
LAB_0012e44a:
      iVar20 = 1;
      if (local_11c < 2) {
        uVar37 = zip->pack_stream_inbytes_remaining;
        zip->pack_stream_inbytes_remaining = uVar37 - local_110;
        uVar33 = zip->folder_outbytes_remaining;
        uVar18 = uVar33;
        if (local_f8 < uVar33) {
          uVar18 = local_f8;
        }
        zip->folder_outbytes_remaining = uVar33 - uVar18;
        sVar30 = zip->uncompressed_buffer_bytes_remaining + uVar18;
        zip->uncompressed_buffer_bytes_remaining = sVar30;
        zip->pack_stream_bytes_unconsumed = local_110;
        iVar20 = 2;
        if ((sVar30 != zip->uncompressed_buffer_size) &&
           ((((zip->codec2 != 0x3030103 || (sVar30 + 5 <= zip->uncompressed_buffer_size)) ||
             (zip->odd_bcj_size == 0)) && ((uVar37 != local_110 || (local_f8 < uVar33)))))) {
          if ((local_11c != 0) || (uVar18 == 0 && local_110 == 0)) {
            iVar20 = -1;
            pcVar23 = "Damaged 7-Zip archive";
            goto LAB_0012d7a3;
          }
          read_consume(a);
          iVar20 = 0;
        }
      }
    }
  } while (iVar20 == 0);
  if (iVar20 != 2) {
    return -0x1e;
  }
  if (local_88 <= zip->uncompressed_buffer_bytes_remaining) {
    zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
    return 0;
  }
  pcVar23 = "Damaged 7-Zip archive";
  iVar20 = -1;
LAB_0012e6ec:
  archive_set_error(&a->archive,iVar20,pcVar23);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}